

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternMatcher.cpp
# Opt level: O3

void __thiscall
AssemblyCode::PatternMatcher::GenerateCodeForNode
          (PatternMatcher *this,INode *node,CTemp *dest,AssemblyCommands *commands)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer ppVar3;
  pointer psVar4;
  PatternMatcher *this_02;
  AssemblyCommands *commands_00;
  int iVar5;
  pointer psVar6;
  pointer ppVar7;
  pointer psVar8;
  pointer psVar9;
  pointer ppVar10;
  ChildrenTemps children;
  AssemblyCommands nodeCommands;
  pair<IRT::CTemp,_const_IRT::INode_*> child;
  vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  local_b8;
  vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  local_98;
  value_type local_80;
  element_type local_70 [2];
  INode *local_60;
  PatternMatcher *local_58;
  AssemblyCommands *local_50;
  pointer local_48;
  INode *local_40;
  CTemp *local_38;
  
  local_98.
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar9 = (this->patterns).
           super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (this->patterns).
             super__Vector_base<std::shared_ptr<IRT::TreePattern>,_std::allocator<std::shared_ptr<IRT::TreePattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = this;
  local_50 = commands;
  local_40 = node;
  local_38 = dest;
  if (psVar9 != local_48) {
    do {
      ppVar7 = local_b8.
               super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = local_b8.
               super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar1 = (psVar9->super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar9->super___shared_ptr<IRT::TreePattern,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      ppVar10 = local_b8.
                super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_b8.
          super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b8.
          super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pcVar2 = (ppVar10->first).name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 != &(ppVar10->first).name.field_2) {
            operator_delete(pcVar2);
          }
          ppVar10 = ppVar10 + 1;
        } while (ppVar10 != ppVar7);
        local_b8.
        super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
      }
      psVar8 = local_98.
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar4 = local_98.
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar6 = local_98.
               super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_98.
          super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_98.
          super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          this_01 = (psVar6->
                    super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          psVar6 = psVar6 + 1;
        } while (psVar6 != psVar8);
        local_98.
        super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar4;
      }
      iVar5 = (*peVar1->_vptr_TreePattern[4])(peVar1,local_40,local_38,&local_b8,&local_98);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      commands_00 = local_50;
      this_02 = local_58;
      ppVar3 = local_b8.
               super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((char)iVar5 != '\0') {
        if (local_b8.
            super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_b8.
            super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          ppVar7 = local_b8.
                   super__Vector_base<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar2 = (ppVar7->first).name._M_dataplus._M_p;
            local_80.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_70;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,pcVar2,pcVar2 + (ppVar7->first).name._M_string_length);
            local_60 = ppVar7->second;
            GenerateCodeForNode(this_02,local_60,(CTemp *)&local_80,commands_00);
            if (local_80.
                super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != local_70) {
              operator_delete(local_80.
                              super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
            }
            ppVar7 = ppVar7 + 1;
          } while (ppVar7 != ppVar3);
        }
        psVar4 = local_98.
                 super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_98.
            super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_98.
            super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          psVar8 = local_98.
                   super__Vector_base<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_80.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (psVar8->
                     super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            local_80.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (psVar8->
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_80.
                super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_80.
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_80.
                      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_80.
                 super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_80.
                      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            std::
            vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
            ::push_back(commands_00,&local_80);
            if (local_80.
                super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_80.
                         super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            psVar8 = psVar8 + 1;
          } while (psVar8 != psVar4);
        }
        std::
        vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
        ::~vector(&local_b8);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
        ::~vector(&local_98);
        return;
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != local_48);
  }
  __assert_fail("result",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/PatternMatcher.cpp"
                ,0x18,
                "void AssemblyCode::PatternMatcher::GenerateCodeForNode(const IRT::INode *, const IRT::CTemp &, AssemblyCommands &)"
               );
}

Assistant:

void AssemblyCode::PatternMatcher::GenerateCodeForNode( const IRT::INode *node, const IRT::CTemp &dest,
                                                        AssemblyCommands &commands ) {

    AssemblyCommands nodeCommands;
    ChildrenTemps children;
    bool result = false;
    int i = 0;
    for ( auto pattern : patterns ) {
        children.clear( );
        nodeCommands.clear( );
        result = pattern->TryToGenerateCode( node, dest, children, nodeCommands );
        if ( result ) {
            break;
        }
        ++i;
    }
    assert( result );
    for ( auto child : children ) {
        GenerateCodeForNode( child.second, child.first, commands );
    }
    for ( auto command: nodeCommands ) {
        commands.push_back( command );
    }
}